

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf_lin_fuzzer.cc
# Opt level: O3

void __thiscall FuzzHelper::testWrite(FuzzHelper *this)

{
  _Head_base<0UL,_Buffer::Members_*,_false> this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  _Head_base<0UL,_Buffer::Members_*,_false> this_03;
  _Head_base<0UL,_Buffer::Members_*,_false> local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  shared_ptr<QPDFWriter> local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  getQpdf((FuzzHelper *)&local_48);
  this_01 = p_Stack_40;
  local_28._M_allocated_capacity = (size_type)local_48._M_head_impl;
  local_28._8_8_ = p_Stack_40;
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Stack_40->_M_use_count = p_Stack_40->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Stack_40->_M_use_count = p_Stack_40->_M_use_count + 1;
    }
  }
  getWriter((FuzzHelper *)&local_48,(shared_ptr<QPDF> *)this);
  this_02 = p_Stack_40;
  this_00._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (Members *)0x0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_);
  }
  QPDFWriter::setDeterministicID((QPDFWriter *)this_00._M_head_impl,true);
  QPDFWriter::setObjectStreamMode((QPDFWriter *)this_00._M_head_impl,qpdf_o_generate);
  this_03._M_head_impl = this_00._M_head_impl;
  QPDFWriter::setLinearization((QPDFWriter *)this_00._M_head_impl,true);
  local_38.super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00._M_head_impl;
  local_38.super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_02;
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_02->_M_use_count = this_02->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_02->_M_use_count = this_02->_M_use_count + 1;
    }
  }
  doWrite((FuzzHelper *)this_03._M_head_impl,&local_38);
  if (local_38.super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

void
FuzzHelper::testWrite()
{
    // Write in various ways to exercise QPDFWriter

    std::shared_ptr<QPDF> q;
    std::shared_ptr<QPDFWriter> w;

    q = getQpdf();
    w = getWriter(q);
    w->setDeterministicID(true);
    w->setObjectStreamMode(qpdf_o_generate);
    w->setLinearization(true);
    doWrite(w);
}